

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

GLenum __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexParameterCase::getExpectedError
          (NegativeTexParameterCase *this)

{
  NegativeTexParameterCase *this_local;
  
  switch(this->m_texParam) {
  case TEXTURE_MIN_FILTER:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_MAG_FILTER:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_WRAP_S:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_WRAP_T:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_WRAP_R:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_MIN_LOD:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_MAX_LOD:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_COMPARE_MODE:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_COMPARE_FUNC:
    this_local._4_4_ = 0x500;
    break;
  case TEXTURE_BASE_LEVEL:
    this_local._4_4_ = 0x502;
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLenum NegativeTexParameterCase::getExpectedError (void) const
{
	switch (m_texParam)
	{
		case TEXTURE_MIN_FILTER:	return GL_INVALID_ENUM;
		case TEXTURE_MAG_FILTER:	return GL_INVALID_ENUM;
		case TEXTURE_WRAP_S:		return GL_INVALID_ENUM;
		case TEXTURE_WRAP_T:		return GL_INVALID_ENUM;
		case TEXTURE_WRAP_R:		return GL_INVALID_ENUM;
		case TEXTURE_MIN_LOD:		return GL_INVALID_ENUM;
		case TEXTURE_MAX_LOD:		return GL_INVALID_ENUM;
		case TEXTURE_COMPARE_MODE:	return GL_INVALID_ENUM;
		case TEXTURE_COMPARE_FUNC:	return GL_INVALID_ENUM;
		case TEXTURE_BASE_LEVEL:	return GL_INVALID_OPERATION;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}